

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 tcu::sampleCubeSeamlessLinear
               (ConstPixelBufferAccess (*faceAccesses) [6],CubeFace baseFace,Sampler *sampler,
               float s,float t,int depth)

{
  int iVar1;
  undefined4 in_register_0000000c;
  Vec4 (*paVVar2) [4];
  Vec4 (*dst) [4];
  Vector<float,_4> *res;
  undefined4 in_register_00000034;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vec4 VVar8;
  Vec4 sampleColors [4];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  dst = (Vec4 (*) [4])CONCAT44(in_register_0000000c,depth);
  if (*(char *)((*dst)[1].m_data + 2) == '\x01') {
    iVar1 = (*(ConstPixelBufferAccess (*) [6])CONCAT44(in_register_00000034,baseFace))[0].m_size.
            m_data[0];
    fVar5 = (*dst)[0].m_data[0];
    fVar4 = 0.0;
    paVVar2 = dst;
    if ((uint)fVar5 < 7) {
      paVVar2 = (Vec4 (*) [4])0x57;
      if ((0x57U >> ((uint)fVar5 & 0x1f) & 1) == 0) {
        if (fVar5 == 4.2039e-45) {
          fVar5 = floorf(s);
          fVar4 = (s - fVar5) * (float)iVar1;
        }
        else {
          fVar4 = s * 0.5;
          fVar5 = floorf(fVar4);
          if ((fVar4 - fVar5 != 0.5) || (NAN(fVar4 - fVar5))) {
            fVar5 = floorf(fVar4 + 0.5);
          }
          else {
            fVar5 = 0.0;
            if (((long)(fVar4 + -0.5) & 1U) != 0) {
              fVar5 = 1.0;
            }
            fVar5 = fVar4 + -0.5 + fVar5;
          }
          fVar5 = s - (fVar5 + fVar5);
          uVar3 = -(uint)(-fVar5 <= fVar5);
          fVar4 = (float)(~uVar3 & (uint)-fVar5 | (uint)fVar5 & uVar3) * (float)iVar1;
        }
      }
      else {
        fVar4 = (float)iVar1 * s;
      }
    }
    fVar5 = (*dst)[0].m_data[1];
    s = fVar4;
    if ((uint)fVar5 < 7) {
      dst = (Vec4 (*) [4])0x57;
      if ((0x57U >> ((uint)fVar5 & 0x1f) & 1) == 0) {
        if (fVar5 == 4.2039e-45) {
          fVar5 = floorf(t);
          fVar5 = t - fVar5;
        }
        else {
          fVar5 = t * 0.5;
          fVar4 = floorf(fVar5);
          if ((fVar5 - fVar4 != 0.5) || (NAN(fVar5 - fVar4))) {
            fVar4 = floorf(fVar5 + 0.5);
          }
          else {
            fVar4 = 0.0;
            if (((long)(fVar5 + -0.5) & 1U) != 0) {
              fVar4 = 1.0;
            }
            fVar4 = fVar5 + -0.5 + fVar4;
          }
          fVar5 = t - (fVar4 + fVar4);
          uVar3 = -(uint)(-fVar5 <= fVar5);
          fVar5 = (float)(~uVar3 & (uint)-fVar5 | (uint)fVar5 & uVar3);
        }
        t = fVar5 * (float)iVar1;
      }
      else {
        t = t * (float)iVar1;
      }
    }
    else {
      t = 0.0;
      dst = paVVar2;
    }
  }
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  getCubeLinearSamples
            ((ConstPixelBufferAccess (*) [6])CONCAT44(in_register_00000034,baseFace),
             (CubeFace)sampler,s,t,(int)&local_68,dst);
  fVar5 = floorf(s + -0.5);
  fVar5 = (s + -0.5) - fVar5;
  fVar4 = floorf(t + -0.5);
  fVar6 = 1.0 - fVar5;
  fVar4 = (t + -0.5) - fVar4;
  fVar7 = 1.0 - fVar4;
  VVar8.m_data[0] = (float)local_58 * fVar5 * fVar7 + (float)local_68 * fVar6 * fVar7;
  VVar8.m_data[1] = local_58._4_4_ * fVar5 * fVar7 + local_68._4_4_ * fVar6 * fVar7;
  VVar8.m_data[2] = fVar6 * (float)local_48 * fVar4 + VVar8.m_data[0];
  VVar8.m_data[3] = fVar6 * local_48._4_4_ * fVar4 + VVar8.m_data[1];
  (*faceAccesses)[0].m_format.order =
       (ChannelOrder)(fVar5 * (float)local_38 * fVar4 + VVar8.m_data[2]);
  (*faceAccesses)[0].m_format.type = (ChannelType)(fVar5 * local_38._4_4_ * fVar4 + VVar8.m_data[3])
  ;
  (*faceAccesses)[0].m_size.m_data[0] =
       (int)(fVar5 * (float)uStack_30 * fVar4 +
            fVar6 * (float)uStack_40 * fVar4 +
            (float)uStack_50 * fVar5 * fVar7 + (float)uStack_60 * fVar6 * fVar7);
  (*faceAccesses)[0].m_size.m_data[1] =
       (int)(fVar5 * uStack_30._4_4_ * fVar4 +
            fVar6 * uStack_40._4_4_ * fVar4 +
            uStack_50._4_4_ * fVar5 * fVar7 + uStack_60._4_4_ * fVar6 * fVar7);
  return (Vec4)VVar8.m_data;
}

Assistant:

static Vec4 sampleCubeSeamlessLinear (const ConstPixelBufferAccess (&faceAccesses)[CUBEFACE_LAST], CubeFace baseFace, const Sampler& sampler, float s, float t, int depth)
{
	DE_ASSERT(faceAccesses[0].getWidth() == faceAccesses[0].getHeight());

	int		size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float	u		= s;
	float	v		= t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, s, size);
		v = unnormalize(sampler.wrapT, t, size);
	}

	// Get sample colors.

	Vec4 sampleColors[4];
	getCubeLinearSamples(faceAccesses, baseFace, u, v, depth, sampleColors);

	// Interpolate.

	float a = deFloatFrac(u-0.5f);
	float b = deFloatFrac(v-0.5f);

	return (sampleColors[0]*(1.0f-a)*(1.0f-b)) +
		   (sampleColors[1]*(     a)*(1.0f-b)) +
		   (sampleColors[2]*(1.0f-a)*(     b)) +
		   (sampleColors[3]*(     a)*(     b));
}